

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O0

string * __thiscall
flatbuffers::jsons::(anonymous_namespace)::GenType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BaseType type)

{
  char cVar1;
  uchar t;
  short sVar2;
  unsigned_short t_00;
  int iVar3;
  uint t_01;
  long lVar4;
  unsigned_long t_02;
  allocator<char> local_2ab;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  BaseType type_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch(local_14) {
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"type\" : \"boolean\"",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 3:
    cVar1 = std::numeric_limits<signed_char>::min();
    NumToString<signed_char>(&local_88,cVar1);
    std::operator+(&local_68,"\"type\" : \"integer\", \"minimum\" : ",&local_88);
    std::operator+(&local_48,&local_68,", \"maximum\" : ");
    cVar1 = std::numeric_limits<signed_char>::max();
    NumToString<signed_char>(&local_a8,cVar1);
    std::operator+(__return_storage_ptr__,&local_48,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case 4:
    t = std::numeric_limits<unsigned_char>::max();
    NumToString<unsigned_char>(&local_c8,t);
    std::operator+(__return_storage_ptr__,"\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" :",
                   &local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    break;
  case 5:
    sVar2 = std::numeric_limits<short>::min();
    NumToString<short>(&local_128,sVar2);
    std::operator+(&local_108,"\"type\" : \"integer\", \"minimum\" : ",&local_128);
    std::operator+(&local_e8,&local_108,", \"maximum\" : ");
    sVar2 = std::numeric_limits<short>::max();
    NumToString<short>(&local_148,sVar2);
    std::operator+(__return_storage_ptr__,&local_e8,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    break;
  case 6:
    t_00 = std::numeric_limits<unsigned_short>::max();
    NumToString<unsigned_short>(&local_168,t_00);
    std::operator+(__return_storage_ptr__,"\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : ",
                   &local_168);
    std::__cxx11::string::~string((string *)&local_168);
    break;
  case 7:
    iVar3 = std::numeric_limits<int>::min();
    NumToString<int>(&local_1c8,iVar3);
    std::operator+(&local_1a8,"\"type\" : \"integer\", \"minimum\" : ",&local_1c8);
    std::operator+(&local_188,&local_1a8,", \"maximum\" : ");
    iVar3 = std::numeric_limits<int>::max();
    NumToString<int>(&local_1e8,iVar3);
    std::operator+(__return_storage_ptr__,&local_188,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    break;
  case 8:
    t_01 = std::numeric_limits<unsigned_int>::max();
    NumToString<unsigned_int>(&local_208,t_01);
    std::operator+(__return_storage_ptr__,"\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : ",
                   &local_208);
    std::__cxx11::string::~string((string *)&local_208);
    break;
  case 9:
    lVar4 = std::numeric_limits<long>::min();
    NumToString<long>(&local_268,lVar4);
    std::operator+(&local_248,"\"type\" : \"integer\", \"minimum\" : ",&local_268);
    std::operator+(&local_228,&local_248,", \"maximum\" : ");
    lVar4 = std::numeric_limits<long>::max();
    NumToString<long>(&local_288,lVar4);
    std::operator+(__return_storage_ptr__,&local_228,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    break;
  case 10:
    t_02 = std::numeric_limits<unsigned_long>::max();
    NumToString<unsigned_long>(&local_2a8,t_02);
    std::operator+(__return_storage_ptr__,"\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : ",
                   &local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    break;
  case 0xb:
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"type\" : \"number\"",&local_2a9);
    std::allocator<char>::~allocator(&local_2a9);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"type\" : \"string\"",&local_2aa);
    std::allocator<char>::~allocator(&local_2aa);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2ab);
    std::allocator<char>::~allocator(&local_2ab);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(BaseType type) {
  switch (type) {
    case BASE_TYPE_BOOL: return "\"type\" : \"boolean\"";
    case BASE_TYPE_CHAR:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int8_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int8_t>::max());
    case BASE_TYPE_UCHAR:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" :" +
             NumToString(std::numeric_limits<uint8_t>::max());
    case BASE_TYPE_SHORT:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int16_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int16_t>::max());
    case BASE_TYPE_USHORT:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint16_t>::max());
    case BASE_TYPE_INT:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int32_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int32_t>::max());
    case BASE_TYPE_UINT:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint32_t>::max());
    case BASE_TYPE_LONG:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int64_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int64_t>::max());
    case BASE_TYPE_ULONG:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint64_t>::max());
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_DOUBLE: return "\"type\" : \"number\"";
    case BASE_TYPE_STRING: return "\"type\" : \"string\"";
    default: return "";
  }
}